

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::LocationRecorder
          (LocationRecorder *this,Parser *parser)

{
  int iVar1;
  SourceCodeInfo *pSVar2;
  void **ppvVar3;
  int iVar4;
  SourceCodeInfo_Location *pSVar5;
  Tokenizer *pTVar6;
  SourceCodeInfo_Location *pSVar7;
  
  this->parser_ = parser;
  pSVar2 = parser->source_code_info_;
  iVar1 = (pSVar2->location_).super_RepeatedPtrFieldBase.current_size_;
  iVar4 = (pSVar2->location_).super_RepeatedPtrFieldBase.allocated_size_;
  if (iVar1 < iVar4) {
    ppvVar3 = (pSVar2->location_).super_RepeatedPtrFieldBase.elements_;
    (pSVar2->location_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pSVar5 = (SourceCodeInfo_Location *)ppvVar3[iVar1];
  }
  else {
    if (iVar4 == (pSVar2->location_).super_RepeatedPtrFieldBase.total_size_) {
      internal::RepeatedPtrFieldBase::Reserve
                (&(pSVar2->location_).super_RepeatedPtrFieldBase,iVar4 + 1);
      iVar4 = (pSVar2->location_).super_RepeatedPtrFieldBase.allocated_size_;
    }
    (pSVar2->location_).super_RepeatedPtrFieldBase.allocated_size_ = iVar4 + 1;
    pSVar5 = internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>::New();
    ppvVar3 = (pSVar2->location_).super_RepeatedPtrFieldBase.elements_;
    iVar1 = (pSVar2->location_).super_RepeatedPtrFieldBase.current_size_;
    (pSVar2->location_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    ppvVar3[iVar1] = pSVar5;
    parser = this->parser_;
  }
  this->location_ = pSVar5;
  pTVar6 = parser->input_;
  iVar1 = (pTVar6->current_).line;
  iVar4 = (pSVar5->span_).current_size_;
  pSVar7 = pSVar5;
  if (iVar4 == (pSVar5->span_).total_size_) {
    RepeatedField<int>::Reserve(&pSVar5->span_,iVar4 + 1);
    iVar4 = (pSVar5->span_).current_size_;
    pTVar6 = this->parser_->input_;
    pSVar7 = this->location_;
  }
  (pSVar5->span_).current_size_ = iVar4 + 1;
  (pSVar5->span_).elements_[iVar4] = iVar1;
  iVar1 = (pTVar6->current_).column;
  iVar4 = (pSVar7->span_).current_size_;
  if (iVar4 == (pSVar7->span_).total_size_) {
    RepeatedField<int>::Reserve(&pSVar7->span_,iVar4 + 1);
    iVar4 = (pSVar7->span_).current_size_;
  }
  (pSVar7->span_).current_size_ = iVar4 + 1;
  (pSVar7->span_).elements_[iVar4] = iVar1;
  return;
}

Assistant:

Parser::LocationRecorder::LocationRecorder(Parser* parser)
  : parser_(parser),
    location_(parser_->source_code_info_->add_location()) {
  location_->add_span(parser_->input_->current().line);
  location_->add_span(parser_->input_->current().column);
}